

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O3

int SetOptionsComputerRS232Port
              (HANDLE hDev,UINT BaudRate,BYTE ParityMode,BOOL bCheckParity,BYTE nbDataBits,
              BYTE StopBitsMode,UINT timeout)

{
  int iVar1;
  UINT UVar2;
  uint uVar3;
  uint uVar4;
  int __fd;
  speed_t __speed;
  termios local_a8;
  undefined8 local_68;
  ulong uStack_60;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  local_a8.c_cc[0x1f] = '\0';
  local_a8._49_3_ = 0;
  local_a8.c_ispeed = 0;
  local_a8.c_ospeed = 0;
  local_a8.c_cc[0xf] = '\0';
  local_a8.c_cc[0x10] = '\0';
  local_a8.c_cc[0x11] = '\0';
  local_a8.c_cc[0x12] = '\0';
  local_a8.c_cc[0x13] = '\0';
  local_a8.c_cc[0x14] = '\0';
  local_a8.c_cc[0x15] = '\0';
  local_a8.c_cc[0x16] = '\0';
  local_a8.c_cc[0x17] = '\0';
  local_a8.c_cc[0x18] = '\0';
  local_a8.c_cc[0x19] = '\0';
  local_a8.c_cc[0x1a] = '\0';
  local_a8.c_cc[0x1b] = '\0';
  local_a8.c_cc[0x1c] = '\0';
  local_a8.c_cc[0x1d] = '\0';
  local_a8.c_cc[0x1e] = '\0';
  local_a8.c_line = '\0';
  local_a8.c_cc[0] = '\0';
  local_a8.c_cc[1] = '\0';
  local_a8.c_cc[2] = '\0';
  local_a8.c_cc[3] = '\0';
  local_a8.c_cc[4] = '\0';
  local_a8.c_cc[5] = '\0';
  local_a8.c_cc[6] = '\0';
  local_a8.c_cc[7] = '\0';
  local_a8.c_cc[8] = '\0';
  local_a8.c_cc[9] = '\0';
  local_a8.c_cc[10] = '\0';
  local_a8.c_cc[0xb] = '\0';
  local_a8.c_cc[0xc] = '\0';
  local_a8.c_cc[0xd] = '\0';
  local_a8.c_cc[0xe] = '\0';
  local_a8.c_iflag = 0;
  local_a8.c_oflag = 0;
  local_a8.c_cflag = 0;
  local_a8.c_lflag = 0;
  __fd = (int)hDev;
  iVar1 = tcgetattr(__fd,&local_a8);
  if (iVar1 != 0) {
    return 1;
  }
  cfmakeraw(&local_a8);
  local_a8._8_8_ = local_a8._8_8_ & 0xffff7f847ffff77f | 0x880;
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffc2ffffe23c;
  UVar2 = _BaudRate2Constant(BaudRate);
  __speed = 0xf;
  if (UVar2 != 0) {
    __speed = UVar2;
  }
  iVar1 = cfsetospeed(&local_a8,__speed);
  if ((iVar1 == 0) && (iVar1 = cfsetispeed(&local_a8,__speed), iVar1 == 0)) {
    switch(ParityMode) {
    case '\0':
      uVar3 = local_a8.c_cflag & 0xbffffcff;
      break;
    case '\x01':
      uVar3 = local_a8.c_cflag & 0xbffffcff | 0x300;
      break;
    case '\x02':
      uVar3 = local_a8.c_cflag & 0xbffffcff | 0x100;
      break;
    case '\x03':
      uVar3 = local_a8.c_cflag & 0xbffffcff | 0x40000200;
      break;
    case '\x04':
      uVar3 = local_a8.c_cflag & 0xbffffcff | 0x40000000;
      break;
    default:
      return 1;
    }
    local_a8.c_iflag = (local_a8.c_iflag & 0xffffffc3) + (uint)(bCheckParity != 0) * 0x10 + 4;
    if (3 < nbDataBits - 5) {
      return 1;
    }
    uVar4 = uVar3 & 0xffffffcf;
    switch((uint)nbDataBits) {
    case 6:
      uVar4 = uVar4 | 0x10;
      break;
    case 7:
      uVar4 = uVar4 | 0x20;
      break;
    case 8:
      uVar4 = uVar3 | 0x30;
    }
    if (StopBitsMode == '\x02') {
      uVar4 = uVar4 | 0x40;
    }
    else {
      if (StopBitsMode != '\0') {
        return 1;
      }
      uVar4 = uVar4 & 0xffffffbf;
    }
    local_a8.c_cflag = uVar4;
    if (0x63ff < timeout) {
      return 1;
    }
    local_a8.c_cc[5] = (char)((timeout & 0xffff) / 100);
    local_a8.c_cc[6] = '\0';
    iVar1 = tcsetattr(__fd,1,&local_a8);
    if (iVar1 == 0) {
      if (UVar2 == 0) {
        uStack_48 = 0;
        uStack_44 = 0;
        uStack_58 = 0;
        uStack_50 = 0;
        local_4c = 0;
        local_68 = 0;
        uStack_60 = 0;
        iVar1 = ioctl(__fd,0x802c542a);
        if (iVar1 == -1) {
          return 1;
        }
        uStack_60 = uStack_60 & 0xffffffffffffeff0 | 0x1000;
        uStack_44 = CONCAT44(BaudRate,BaudRate);
        iVar1 = ioctl(__fd,0x402c542b);
        if (iVar1 == -1) {
          return 1;
        }
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

inline int SetOptionsComputerRS232Port(HANDLE hDev, UINT BaudRate, BYTE ParityMode, BOOL bCheckParity, BYTE nbDataBits, 
									   BYTE StopBitsMode, UINT timeout)
{

	// Should we do something like PurgeComm(g_hCom,PURGE_TXABORT|PURGE_RXABORT|PURGE_TXCLEAR|PURGE_RXCLEAR) / tcflush
	// in the beginning of this function?

#ifdef _WIN32
	DCB dcb;
	COMMTIMEOUTS timeouts;

	memset(&dcb, 0, sizeof(DCB));

	if (!GetCommState(hDev, &dcb))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	memset(&timeouts, 0, sizeof(COMMTIMEOUTS));

	if (!GetCommTimeouts(hDev, &timeouts))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// Binary mode.
	dcb.fBinary = TRUE;
	// No flow control.
	dcb.fOutxCtsFlow = FALSE;			
	dcb.fOutxDsrFlow = FALSE;
	dcb.fDtrControl = DTR_CONTROL_DISABLE;
	dcb.fDsrSensitivity = FALSE;		 
	dcb.fOutX = FALSE;
	dcb.fInX = FALSE;
	dcb.fRtsControl = RTS_CONTROL_DISABLE;
	dcb.fAbortOnError = FALSE;

	dcb.BaudRate = _BaudRate2Constant(BaudRate);
	if (dcb.BaudRate == 0)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			"Invalid BaudRate. ", 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// An even parity bit will be set to "1" if the number of 1's + 1 is even, and an odd 
	// parity bit will be set to "1" if the number of 1's +1 is odd.
	// If the parity bit is present but not used, it may be referred to as mark parity 
	// (when the parity bit is always 1) or space parity (the bit is always 0).
	// None parity means that no parity bit is sent at all. 
	dcb.Parity = ParityMode;
	dcb.fParity = bCheckParity;
	dcb.fErrorChar = FALSE; // Indicates whether bytes received with parity errors are 
	// replaced with the character specified by the ErrorChar member. 
	dcb.ByteSize = nbDataBits;
	dcb.StopBits = StopBitsMode;

	// The SetCommState() function reconfigures the communications resource, but it does not affect
	// the internal output and input buffers of the specified driver. The buffers are not flushed, 
	// and pending read and write operations are not terminated prematurely.
	if (!SetCommState(hDev, &dcb))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// Special mode for read timeouts.
	timeouts.ReadIntervalTimeout = MAXDWORD;
	timeouts.ReadTotalTimeoutConstant = timeout;
	timeouts.ReadTotalTimeoutMultiplier = MAXDWORD;
	//timeouts.WriteTotalTimeoutConstant = 0; // Linux does not seem to have options for write timeouts, so disable for Windows...?
	timeouts.WriteTotalTimeoutConstant = timeout;
	timeouts.WriteTotalTimeoutMultiplier = 0;

	if (!SetCommTimeouts(hDev, &timeouts))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}
#else 
	struct termios options;
	speed_t speed = 0;
	BOOL bCustomBaudrate = FALSE;

	memset(&options, 0, sizeof(options));

	if (tcgetattr((intptr_t)hDev, &options) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// Basic raw/non-canonical setup.
	// The terminal attributes are set as follows : 
	// termios_p->c_iflag &= ~(IGNBRK | BRKINT | PARMRK | ISTRIP | INLCR | IGNCR | ICRNL | IXON);
	// termios_p->c_oflag &= ~OPOST;
	// termios_p->c_lflag &= ~(ECHO | ECHONL | ICANON | ISIG | IEXTEN);
	// termios_p->c_cflag &= ~(CSIZE | PARENB);
	// termios_p->c_cflag |= CS8;
	cfmakeraw(&options);

	// The c_cflag member contains two options that should always be enabled,
	// CLOCAL and CREAD. These will ensure that your program does not become
	// the 'owner' of the port subject to sporatic job control and hangup signals, and
	// also that the serial interface driver will read incoming data bytes.
	options.c_cflag |= (CLOCAL | CREAD);

	// Raw input, no echo, no signals.
	options.c_lflag &= ~(ICANON | IEXTEN | ECHO | ECHOE | ECHOK | ECHONL | ISIG);

	// Raw input.
	options.c_iflag &= ~(IGNBRK | BRKINT | INLCR | IGNCR | ICRNL);

	// Raw output.
	options.c_oflag &= ~(OPOST | ONLCR | ONOCR | ONLRET | OCRNL);

	// Disable hardware flow control.
#ifdef CRTSCTS
	options.c_cflag &= ~CRTSCTS;
#endif // CRTSCTS
#ifdef CNEW_RTSCTS
	options.c_cflag &= ~CNEW_RTSCTS;
#endif // CNEW_RTSCTS

	// Disable software flow control.
	options.c_iflag &= ~(IXON | IXOFF | IXANY);

	speed = _BaudRate2Constant(BaudRate);
	if (speed == 0)
	{
		// Baud rate is probably non-standard...
		bCustomBaudrate = TRUE;

		// See https://stackoverflow.com/questions/19440268/how-to-set-a-non-standard-baudrate-on-a-serial-port-device-on-linux.

		speed = _BaudRate2Constant(38400);

		// Linux-only, not compatible with all devices...?
		//options.c_cflag &= ~(CBAUD | CBAUDEX);
		//options.c_cflag |= speed;
		//tty.alt_speed = BaudRate; // ???
	}

	if (cfsetospeed(&options, speed) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
			strtime_m(),
			GetLastErrorMsg(),
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	if (cfsetispeed(&options, speed) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
			strtime_m(),
			GetLastErrorMsg(),
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// An even parity bit will be set to "1" if the number of 1's + 1 is even, and an odd 
	// parity bit will be set to "1" if the number of 1's +1 is odd.
	// If the parity bit is present but not used, it may be referred to as mark parity 
	// (when the parity bit is always 1) or space parity (the bit is always 0).
	// None parity means that no parity bit is sent at all. 
	switch (ParityMode)
	{
	case NOPARITY:
#ifndef __APPLE__
		options.c_cflag &= ~CMSPAR;
#endif // !__APPLE__
		options.c_cflag &= ~PARENB;
		options.c_cflag &= ~PARODD;
		break;
	case MARKPARITY:
#ifndef __APPLE__
		options.c_cflag |= CMSPAR;
#endif // !__APPLE__
		options.c_cflag &= ~PARENB;
		options.c_cflag |= PARODD;
		break;
	case SPACEPARITY:
#ifndef __APPLE__
		options.c_cflag |= CMSPAR;
#endif // !__APPLE__
		options.c_cflag &= ~PARENB;
		options.c_cflag &= ~PARODD;
		break;
	case ODDPARITY:
#ifndef __APPLE__
		options.c_cflag &= ~CMSPAR;
#endif // !__APPLE__
		options.c_cflag |= PARENB;
		options.c_cflag |= PARODD;
		break;
	case EVENPARITY:
#ifndef __APPLE__
		options.c_cflag &= ~CMSPAR;
#endif // !__APPLE__
		options.c_cflag |= PARENB;
		options.c_cflag &= ~PARODD;
		break;
	default:
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
			strtime_m(),
			"Invalid parity mode. ",
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// The most likely scenario where this flag is useful is if the communication channel is 
	// configured for parity and seven bits per character. In this case, the eigth bit on every 
	// received character is a parity bit, not part of the data payload. The user program does 
	// not need to know the value of the parity bit.
	options.c_iflag &= ~ISTRIP;

	options.c_iflag &= ~PARMRK; // Never mark a framing or parity error with prefix bytes.
	options.c_iflag |= IGNPAR; // A character with a framing or parity error will be discarded.
	// This is only valid (at least for parity errors) if parity checking is enabled.

	if (bCheckParity)
	{
		options.c_iflag |= INPCK;
	}
	else
	{
		options.c_iflag &= ~INPCK;
	}

	options.c_cflag &= ~CSIZE; // Erase the previous flag for the number of data bits.

	switch (nbDataBits)
	{
	case 8:
		options.c_cflag |= CS8;
		break;
	case 7:
		options.c_cflag |= CS7;
		break;
	case 6:
		options.c_cflag |= CS6;
		break;
	case 5:
		options.c_cflag |= CS5;
		break;
	default :
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			"Invalid number of data bits. ", 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	switch (StopBitsMode)
	{
	case ONESTOPBIT:
		options.c_cflag &= ~CSTOPB;
		break;
	case TWOSTOPBITS:
		options.c_cflag |= CSTOPB;
		break;
	default :
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			"Invalid stop bits mode. ", 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	if (timeout/100 > 255)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			"Too high timeout value. ", 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	// Timeouts.
	options.c_cc[VMIN] = 0; // Minimum number of characters to read. 
	options.c_cc[VTIME] = timeout/100; // Time to wait for every character read in tenths of seconds.

	if (tcsetattr((intptr_t)hDev, TCSADRAIN, &options) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
	}

	if (bCustomBaudrate)
	{
#ifndef DISABLE_CUSTOM_BAUDRATE

		// See https://github.com/wjwwood/serial/blob/master/src/impl/unix.cc,
		// https://stackoverflow.com/questions/4968529/how-to-set-baud-rate-to-307200-on-linux/7152671, 
		// https://stackoverflow.com/questions/23492088/c-code-for-non-standard-baud-rate-on-debian-raspberry-pi.

#if defined(__APPLE__) && defined(IOSSIOSPEED)
		
		// See https://developer.apple.com/library/archive/samplecode/SerialPortSample/Listings/SerialPortSample_SerialPortSample_c.html.

		// Starting with Tiger, the IOSSIOSPEED ioctl can be used to set arbitrary baud rates
		// other than those specified by POSIX. The driver for the underlying serial hardware
		// ultimately determines which baud rates can be used. This ioctl sets both the input
		// and output speed.
		speed_t new_baud = (speed_t)BaudRate;

		if (ioctl((intptr_t)hDev, IOSSIOSPEED, &new_baud) == -1)
		{
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : (IOSSIOSPEED) %s"
				"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
				"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
			return EXIT_FAILURE;
		}
#elif defined(__linux__) && defined(TCSETS2)

		// See https://stackoverflow.com/questions/12646324/how-can-i-set-a-custom-baud-rate-on-linux.

		struct termios2 options2;

		memset(&options2, 0, sizeof(struct termios2));
		if (ioctl((intptr_t)hDev, TCGETS2, &options2) == -1)
		{
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : (TCGETS2) %s"
				"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
				"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
			return EXIT_FAILURE;
		}

		options2.c_cflag &= ~CBAUD; // Remove current BAUD rate.
		options2.c_cflag |= BOTHER; // Allow custom BAUD rate using int input.
		options2.c_ispeed = BaudRate; // Set the input BAUD rate.
		options2.c_ospeed = BaudRate; // Set the output BAUD rate.

		if (ioctl((intptr_t)hDev, TCSETS2, &options2) == -1)
		{
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : (TCSETS2) %s"
				"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
				"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
			return EXIT_FAILURE;
		}
#elif defined(__linux__) && defined(TIOCSSERIAL)
		struct serial_struct ser;

		memset(&ser, 0, sizeof(struct serial_struct));
		if (ioctl((intptr_t)hDev, TIOCGSERIAL, &ser) == -1)
		{
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : (TIOCGSERIAL) %s"
				"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
				"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
			return EXIT_FAILURE;
		}

		// Set custom divisor.
		if (BaudRate != 0) ser.custom_divisor = ser.baud_base/(int)BaudRate;
		// Update flags.
		ser.flags &= ~ASYNC_SPD_MASK;
		ser.flags |= ASYNC_SPD_CUST;

		if (ioctl((intptr_t)hDev, TIOCSSERIAL, &ser) == -1)
		{
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : (TIOCSSERIAL) %s"
				"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
				"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
			return EXIT_FAILURE;
		}
#else
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
			strtime_m(),
			"Invalid BaudRate. ",
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
#endif 
#else
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("SetOptionsComputerRS232Port error (%s) : %s"
			"(hDev=%#x, BaudRate=%u, ParityMode=%u, bCheckParity=%u, "
			"nbDataBits=%u, StopBitsMode=%u, timeout=%u)\n",
			strtime_m(),
			"Invalid BaudRate. ",
			hDev, BaudRate, (UINT)ParityMode, (UINT)bCheckParity, (UINT)nbDataBits, (UINT)StopBitsMode, timeout));
		return EXIT_FAILURE;
#endif // !DISABLE_CUSTOM_BAUDRATE
	}
	

#endif // _WIN32

	return EXIT_SUCCESS;
}